

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

optional_idx duckdb::FileSystem::GetAvailableMemory(void)

{
  idx_t in_RAX;
  int *piVar1;
  long lVar2;
  long lVar3;
  optional_idx local_18;
  
  local_18.index = in_RAX;
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = sysconf(0x55);
  lVar3 = sysconf(0x1e);
  if (*piVar1 == 0) {
    optional_idx::optional_idx(&local_18,lVar3 * lVar2);
  }
  else {
    local_18.index = 0xffffffffffffffff;
  }
  return (optional_idx)local_18.index;
}

Assistant:

optional_idx FileSystem::GetAvailableMemory() {
	errno = 0;

#ifdef __MVS__
	struct rlimit limit;
	int rlim_rc = getrlimit(RLIMIT_AS, &limit);
	idx_t max_memory = MinValue<idx_t>(limit.rlim_max, UINTPTR_MAX);
#else
	idx_t max_memory = MinValue<idx_t>((idx_t)sysconf(_SC_PHYS_PAGES) * (idx_t)sysconf(_SC_PAGESIZE), UINTPTR_MAX);
#endif
	if (errno != 0) {
		return optional_idx();
	}
	return max_memory;
}